

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O0

IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *
initialize_iothub_client
          (IOTHUB_CLIENT_CONFIG *client_config,IOTHUB_CLIENT_DEVICE_CONFIG *device_config,
          _Bool use_dev_auth,char *module_id)

{
  int iVar1;
  IOTHUB_CLIENT_RESULT IVar2;
  time_t tVar3;
  IOTHUB_AUTHORIZATION_HANDLE pIVar4;
  LOGGER_LOG p_Var5;
  TRANSPORT_PROVIDER *pTVar6;
  long lVar7;
  TICK_COUNTER_HANDLE pTVar8;
  STRING_HANDLE pSVar9;
  LOGGER_LOG local_210;
  size_t local_208;
  long local_200;
  ulong local_1f8;
  LOGGER_LOG l_15;
  LOGGER_LOG l_14;
  IOTHUB_DEVICE_CONFIG deviceConfig;
  LOGGER_LOG l_13;
  LOGGER_LOG l_12;
  LOGGER_LOG l_11;
  LOGGER_LOG p_Stack_188;
  PLATFORM_INFO_OPTION supportedPlatformInfo;
  LOGGER_LOG l_10;
  LOGGER_LOG l_9;
  LOGGER_LOG l_8;
  LOGGER_LOG l_7;
  size_t malloc_size_hub_suffix;
  size_t calloc_size_hub_name;
  size_t suffix_len;
  LOGGER_LOG l_6;
  char *whereIsDot;
  char *hostname;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  STRING_HANDLE transport_hostname;
  LOGGER_LOG l_3;
  IOTHUBTRANSPORT_CONFIG lowerLayerConfig;
  TRANSPORT_CALLBACKS_INFO transport_cb;
  LOGGER_LOG l_2;
  char *sas_token;
  char *device_id;
  char *device_key;
  LOGGER_LOG l_1;
  char *IoTHubSuffix;
  char *IoTHubName;
  IOTHUB_CLIENT_CONFIG *config;
  IOTHUB_CLIENT_CONFIG actual_config;
  LOGGER_LOG l;
  IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *result;
  char *module_id_local;
  _Bool use_dev_auth_local;
  IOTHUB_CLIENT_DEVICE_CONFIG *device_config_local;
  IOTHUB_CLIENT_CONFIG *client_config_local;
  
  tVar3 = get_time((time_t *)0x0);
  srand((uint)tVar3);
  l = (LOGGER_LOG)malloc(0x1d0);
  if (l == (LOGGER_LOG)0x0) {
    actual_config.protocolGatewayHostName = (char *)xlogging_get_log_function();
    if ((LOGGER_LOG)actual_config.protocolGatewayHostName != (LOGGER_LOG)0x0) {
      (*(code *)actual_config.protocolGatewayHostName)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                 ,"initialize_iothub_client",0x382,1,
                 "failure allocating IOTHUB_CLIENT_CORE_LL_HANDLE_DATA");
    }
  }
  else {
    IoTHubName = (char *)0x0;
    IoTHubSuffix = (char *)0x0;
    l_1 = (LOGGER_LOG)0x0;
    memset(l,0,0x1d0);
    if (use_dev_auth) {
      pIVar4 = IoTHubClient_Auth_CreateFromDeviceAuth(client_config->deviceId,module_id);
      *(IOTHUB_AUTHORIZATION_HANDLE *)(l + 0x1a8) = pIVar4;
      if (pIVar4 == (IOTHUB_AUTHORIZATION_HANDLE)0x0) {
        p_Var5 = xlogging_get_log_function();
        if (p_Var5 != (LOGGER_LOG)0x0) {
          (*p_Var5)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                    ,"initialize_iothub_client",0x390,1,"Failed create authorization module");
        }
        free(l);
        l = (LOGGER_LOG)0x0;
      }
    }
    else {
      if (device_config == (IOTHUB_CLIENT_DEVICE_CONFIG *)0x0) {
        device_id = client_config->deviceKey;
        sas_token = client_config->deviceId;
        l_2 = (LOGGER_LOG)client_config->deviceSasToken;
      }
      else {
        device_id = device_config->deviceKey;
        sas_token = device_config->deviceId;
        l_2 = (LOGGER_LOG)device_config->deviceSasToken;
      }
      pIVar4 = IoTHubClient_Auth_Create(device_id,sas_token,(char *)l_2,module_id);
      *(IOTHUB_AUTHORIZATION_HANDLE *)(l + 0x1a8) = pIVar4;
      if (pIVar4 == (IOTHUB_AUTHORIZATION_HANDLE)0x0) {
        p_Var5 = xlogging_get_log_function();
        if (p_Var5 != (LOGGER_LOG)0x0) {
          (*p_Var5)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                    ,"initialize_iothub_client",0x3a9,1,"Failed create authorization module");
        }
        free(l);
        l = (LOGGER_LOG)0x0;
      }
    }
    if (l != (LOGGER_LOG)0x0) {
      memset(&lowerLayerConfig.moduleId,0,0x48);
      lowerLayerConfig.moduleId = (char *)IoTHubClientCore_LL_MessageCallbackFromInput;
      if (client_config == (IOTHUB_CLIENT_CONFIG *)0x0) {
        if (device_config != (IOTHUB_CLIENT_DEVICE_CONFIG *)0x0) {
          l_4 = (LOGGER_LOG)0x0;
          *(void **)(l + 0x30) = device_config->transportHandle;
          pTVar6 = (*device_config->protocol)();
          setTransportProtocol((IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *)l,pTVar6);
          iVar1 = (**(code **)(l + 0xe8))(*(undefined8 *)(l + 0x30),l);
          if (iVar1 == 0) {
            l_4 = (LOGGER_LOG)(**(code **)(l + 0x80))();
            if ((STRING_HANDLE)l_4 == (STRING_HANDLE)0x0) {
              hostname = (char *)xlogging_get_log_function();
              if ((LOGGER_LOG)hostname != (LOGGER_LOG)0x0) {
                (*(code *)hostname)(AZ_LOG_ERROR,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                                    ,"initialize_iothub_client",999,1,
                                    "unable to determine the transport IoTHub name");
              }
              IoTHubClient_Auth_Destroy(*(IOTHUB_AUTHORIZATION_HANDLE *)(l + 0x1a8));
              free(l);
              l = (LOGGER_LOG)0x0;
            }
            else {
              whereIsDot = STRING_c_str((STRING_HANDLE)l_4);
              l_6 = (LOGGER_LOG)strchr(whereIsDot,0x2e);
              if (l_6 == (LOGGER_LOG)0x0) {
                suffix_len = (size_t)xlogging_get_log_function();
                if ((LOGGER_LOG)suffix_len != (LOGGER_LOG)0x0) {
                  (*(code *)suffix_len)
                            (AZ_LOG_ERROR,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                             ,"initialize_iothub_client",0x3f3,1,
                             "unable to determine the IoTHub name");
                }
                IoTHubClient_Auth_Destroy(*(IOTHUB_AUTHORIZATION_HANDLE *)(l + 0x1a8));
                free(l);
                l = (LOGGER_LOG)0x0;
              }
              else {
                calloc_size_hub_name = strlen((char *)l_6);
                if (l_6 < whereIsDot) {
                  local_1f8 = 0xffffffffffffffff;
                }
                else {
                  local_1f8 = (long)l_6 - (long)whereIsDot;
                }
                if (local_1f8 < 0xfffffffffffffffe) {
                  if (l_6 < whereIsDot) {
                    local_200 = -1;
                  }
                  else {
                    local_200 = (long)l_6 - (long)whereIsDot;
                  }
                  local_208 = local_200 + 1;
                }
                else {
                  local_208 = 0xffffffffffffffff;
                }
                malloc_size_hub_suffix = local_208;
                if (calloc_size_hub_name < 0xfffffffffffffffe) {
                  local_210 = (LOGGER_LOG)(calloc_size_hub_name + 1);
                }
                else {
                  local_210 = (LOGGER_LOG)0xffffffffffffffff;
                }
                l_7 = local_210;
                if ((local_208 == 0xffffffffffffffff) ||
                   (IoTHubSuffix = (char *)calloc(1,local_208), IoTHubSuffix == (char *)0x0)) {
                  l_8 = xlogging_get_log_function();
                  if (l_8 != (LOGGER_LOG)0x0) {
                    (*l_8)(AZ_LOG_ERROR,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                           ,"initialize_iothub_client",0x400,1,"unable to calloc, size:%zu",
                           malloc_size_hub_suffix);
                  }
                  IoTHubClient_Auth_Destroy(*(IOTHUB_AUTHORIZATION_HANDLE *)(l + 0x1a8));
                  free(l);
                  l = (LOGGER_LOG)0x0;
                }
                else if ((l_7 == (LOGGER_LOG)0xffffffffffffffff) ||
                        (l_1 = (LOGGER_LOG)malloc((size_t)l_7), l_1 == (LOGGER_LOG)0x0)) {
                  l_9 = xlogging_get_log_function();
                  if (l_9 != (LOGGER_LOG)0x0) {
                    (*l_9)(AZ_LOG_ERROR,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                           ,"initialize_iothub_client",0x408,1,"unable to malloc");
                  }
                  IoTHubClient_Auth_Destroy(*(IOTHUB_AUTHORIZATION_HANDLE *)(l + 0x1a8));
                  free(IoTHubSuffix);
                  free(l);
                  l = (LOGGER_LOG)0x0;
                }
                else {
                  memcpy(IoTHubSuffix,whereIsDot,(long)l_6 - (long)whereIsDot);
                  strcpy((char *)l_1,(char *)(l_6 + 1));
                  actual_config.protocol = (IOTHUB_CLIENT_TRANSPORT_PROVIDER)device_config->deviceId
                  ;
                  actual_config.deviceId = device_config->deviceKey;
                  actual_config.deviceKey = device_config->deviceSasToken;
                  config = (IOTHUB_CLIENT_CONFIG *)0x0;
                  actual_config.iotHubSuffix = (char *)0x0;
                  IoTHubName = (char *)&config;
                  l[0x38] = (code)0x1;
                  actual_config.deviceSasToken = IoTHubSuffix;
                  actual_config.iotHubName = (char *)l_1;
                }
              }
            }
          }
          else {
            l_5 = xlogging_get_log_function();
            if (l_5 != (LOGGER_LOG)0x0) {
              (*l_5)(AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                     ,"initialize_iothub_client",0x3e0,1,"unable to set transport callbacks");
            }
            IoTHubClient_Auth_Destroy(*(IOTHUB_AUTHORIZATION_HANDLE *)(l + 0x1a8));
            free(l);
            l = (LOGGER_LOG)0x0;
          }
          STRING_delete((STRING_HANDLE)l_4);
        }
      }
      else {
        memset(&l_3,0,0x20);
        lowerLayerConfig.upperConfig = (IOTHUB_CLIENT_CONFIG *)l;
        lowerLayerConfig.waitingToSend = *(PDLIST_ENTRY *)(l + 0x1a8);
        l_3 = (LOGGER_LOG)client_config;
        lowerLayerConfig.auth_module_handle = (IOTHUB_AUTHORIZATION_HANDLE)module_id;
        pTVar6 = (*client_config->protocol)();
        setTransportProtocol((IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *)l,pTVar6);
        lVar7 = (**(code **)(l + 0x90))(&l_3,&lowerLayerConfig.moduleId,l);
        *(long *)(l + 0x30) = lVar7;
        if (lVar7 == 0) {
          transport_hostname = (STRING_HANDLE)xlogging_get_log_function();
          if (transport_hostname != (STRING_HANDLE)0x0) {
            (*(code *)transport_hostname)
                      (0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                       ,"initialize_iothub_client",0x3c9,1,"underlying transport failed");
          }
          destroy_blob_upload_module((IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *)l);
          destroy_module_method_module((IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *)l);
          tickcounter_destroy(*(TICK_COUNTER_HANDLE *)(l + 0x160));
          IoTHubClient_Auth_Destroy(*(IOTHUB_AUTHORIZATION_HANDLE *)(l + 0x1a8));
          free(l);
          l = (LOGGER_LOG)0x0;
        }
        else {
          l[0x38] = (code)0x0;
          IoTHubName = (char *)client_config;
        }
      }
    }
    if (l != (LOGGER_LOG)0x0) {
      iVar1 = create_blob_upload_module
                        ((IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *)l,(IOTHUB_CLIENT_CONFIG *)IoTHubName,
                         use_dev_auth);
      if (iVar1 == 0) {
        if ((module_id == (char *)0x0) ||
           (iVar1 = create_edge_handle((IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *)l,
                                       (IOTHUB_CLIENT_CONFIG *)IoTHubName,module_id), iVar1 == 0)) {
          pTVar8 = tickcounter_create();
          *(TICK_COUNTER_HANDLE *)(l + 0x160) = pTVar8;
          if (pTVar8 == (TICK_COUNTER_HANDLE)0x0) {
            p_Var5 = xlogging_get_log_function();
            if (p_Var5 != (LOGGER_LOG)0x0) {
              (*p_Var5)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                        ,"initialize_iothub_client",0x443,1,"unable to get a tickcounter");
            }
            if (((byte)l[0x38] & 1) == 0) {
              (**(code **)(l + 0x98))(*(undefined8 *)(l + 0x30));
            }
            destroy_blob_upload_module((IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *)l);
            destroy_module_method_module((IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *)l);
            IoTHubClient_Auth_Destroy(*(IOTHUB_AUTHORIZATION_HANDLE *)(l + 0x1a8));
            free(l);
            l = (LOGGER_LOG)0x0;
          }
          else {
            iVar1 = (**(code **)(l + 0xf8))(*(undefined8 *)(l + 0x30),(long)&l_11 + 4);
            if (iVar1 == 0) {
              pSVar9 = make_product_info((char *)0x0,l_11._4_4_);
              *(STRING_HANDLE *)(l + 0x1b0) = pSVar9;
              if (pSVar9 == (STRING_HANDLE)0x0) {
                deviceConfig.moduleId = (char *)xlogging_get_log_function();
                if ((LOGGER_LOG)deviceConfig.moduleId != (LOGGER_LOG)0x0) {
                  (*(code *)deviceConfig.moduleId)
                            (AZ_LOG_ERROR,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                             ,"initialize_iothub_client",0x45f,1,"failed to initialize product info"
                            );
                }
                if (((byte)l[0x38] & 1) == 0) {
                  (**(code **)(l + 0x98))(*(undefined8 *)(l + 0x30));
                }
                tickcounter_destroy(*(TICK_COUNTER_HANDLE *)(l + 0x160));
                destroy_blob_upload_module((IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *)l);
                destroy_module_method_module((IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *)l);
                IoTHubClient_Auth_Destroy(*(IOTHUB_AUTHORIZATION_HANDLE *)(l + 0x1a8));
                free(l);
                l = (LOGGER_LOG)0x0;
              }
              else if (IoTHubName != (char *)0x0) {
                DList_InitializeListHead((PDLIST_ENTRY)l);
                DList_InitializeListHead((PDLIST_ENTRY)(l + 0x10));
                DList_InitializeListHead((PDLIST_ENTRY)(l + 0x20));
                *(undefined4 *)(l + 0x100) = 1;
                *(undefined4 *)(l + 0x120) = 1;
                *(undefined8 *)(l + 0x158) = 0xffffffffffffffff;
                *(undefined4 *)(l + 0x1a0) = 1;
                l_14 = *(LOGGER_LOG *)(IoTHubName + 8);
                deviceConfig.deviceId = *(char **)(IoTHubName + 0x10);
                deviceConfig.deviceKey = *(char **)(IoTHubName + 0x18);
                deviceConfig.deviceSasToken = *(char **)(l + 0x1a8);
                deviceConfig.authorization_module = (IOTHUB_AUTHORIZATION_HANDLE)module_id;
                lVar7 = (**(code **)(l + 0xa0))(*(undefined8 *)(l + 0x30),&l_14,l);
                *(long *)(l + 0x40) = lVar7;
                if (lVar7 == 0) {
                  p_Var5 = xlogging_get_log_function();
                  if (p_Var5 != (LOGGER_LOG)0x0) {
                    (*p_Var5)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                              ,"initialize_iothub_client",0x47e,1,
                              "Registering device in transport failed");
                  }
                  IoTHubClient_Auth_Destroy(*(IOTHUB_AUTHORIZATION_HANDLE *)(l + 0x1a8));
                  if (((byte)l[0x38] & 1) == 0) {
                    (**(code **)(l + 0x98))(*(undefined8 *)(l + 0x30));
                  }
                  destroy_blob_upload_module((IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *)l);
                  destroy_module_method_module((IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *)l);
                  tickcounter_destroy(*(TICK_COUNTER_HANDLE *)(l + 0x160));
                  STRING_delete(*(STRING_HANDLE *)(l + 0x1b0));
                  free(l);
                  l = (LOGGER_LOG)0x0;
                }
                else {
                  *(undefined8 *)(l + 0x168) = 0;
                  *(undefined8 *)(l + 0x170) = 0;
                  *(undefined4 *)(l + 0x1bc) = 0;
                  *(undefined4 *)(l + 0x1b8) = 0;
                  IVar2 = IoTHubClientCore_LL_SetRetryPolicy
                                    ((IOTHUB_CLIENT_CORE_LL_HANDLE)l,
                                     IOTHUB_CLIENT_RETRY_EXPONENTIAL_BACKOFF_WITH_JITTER,0);
                  if (IVar2 != IOTHUB_CLIENT_OK) {
                    p_Var5 = xlogging_get_log_function();
                    if (p_Var5 != (LOGGER_LOG)0x0) {
                      (*p_Var5)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                                ,"initialize_iothub_client",0x494,1,
                                "Setting default retry policy in transport failed");
                    }
                    (**(code **)(l + 0xa8))(*(undefined8 *)(l + 0x40));
                    IoTHubClient_Auth_Destroy(*(IOTHUB_AUTHORIZATION_HANDLE *)(l + 0x1a8));
                    if (((byte)l[0x38] & 1) == 0) {
                      (**(code **)(l + 0x98))(*(undefined8 *)(l + 0x30));
                    }
                    destroy_blob_upload_module((IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *)l);
                    destroy_module_method_module((IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *)l);
                    tickcounter_destroy(*(TICK_COUNTER_HANDLE *)(l + 0x160));
                    STRING_delete(*(STRING_HANDLE *)(l + 0x1b0));
                    free(l);
                    l = (LOGGER_LOG)0x0;
                  }
                }
              }
            }
            else {
              p_Var5 = xlogging_get_log_function();
              if (p_Var5 != (LOGGER_LOG)0x0) {
                (*p_Var5)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                          ,"initialize_iothub_client",0x451,1,
                          "failed to get supported platform info");
              }
              if (((byte)l[0x38] & 1) == 0) {
                (**(code **)(l + 0x98))(*(undefined8 *)(l + 0x30));
              }
              tickcounter_destroy(*(TICK_COUNTER_HANDLE *)(l + 0x160));
              destroy_blob_upload_module((IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *)l);
              destroy_module_method_module((IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *)l);
              IoTHubClient_Auth_Destroy(*(IOTHUB_AUTHORIZATION_HANDLE *)(l + 0x1a8));
              free(l);
              l = (LOGGER_LOG)0x0;
            }
          }
        }
        else {
          p_Stack_188 = xlogging_get_log_function();
          if (p_Stack_188 != (LOGGER_LOG)0x0) {
            (*p_Stack_188)(AZ_LOG_ERROR,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                           ,"initialize_iothub_client",0x434,1,
                           "unable to create module method handle");
          }
          if (((byte)l[0x38] & 1) == 0) {
            (**(code **)(l + 0x98))(*(undefined8 *)(l + 0x30));
          }
          destroy_blob_upload_module((IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *)l);
          IoTHubClient_Auth_Destroy(*(IOTHUB_AUTHORIZATION_HANDLE *)(l + 0x1a8));
          free(l);
          l = (LOGGER_LOG)0x0;
        }
      }
      else {
        l_10 = xlogging_get_log_function();
        if (l_10 != (LOGGER_LOG)0x0) {
          (*l_10)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                  ,"initialize_iothub_client",0x428,1,"unable to create blob upload");
        }
        if (((byte)l[0x38] & 1) == 0) {
          (**(code **)(l + 0x98))(*(undefined8 *)(l + 0x30));
        }
        destroy_blob_upload_module((IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *)l);
        IoTHubClient_Auth_Destroy(*(IOTHUB_AUTHORIZATION_HANDLE *)(l + 0x1a8));
        free(l);
        l = (LOGGER_LOG)0x0;
      }
    }
    if (IoTHubSuffix != (char *)0x0) {
      free(IoTHubSuffix);
    }
    if (l_1 != (LOGGER_LOG)0x0) {
      free(l_1);
    }
  }
  return (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *)l;
}

Assistant:

static IOTHUB_CLIENT_CORE_LL_HANDLE_DATA* initialize_iothub_client(const IOTHUB_CLIENT_CONFIG* client_config, const IOTHUB_CLIENT_DEVICE_CONFIG* device_config, bool use_dev_auth, const char* module_id)
{
    IOTHUB_CLIENT_CORE_LL_HANDLE_DATA* result;
    srand((unsigned int)get_time(NULL));

    result = (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA*)malloc(sizeof(IOTHUB_CLIENT_CORE_LL_HANDLE_DATA));
    if (result == NULL)
    {
        LogError("failure allocating IOTHUB_CLIENT_CORE_LL_HANDLE_DATA");
    }
    else
    {
        IOTHUB_CLIENT_CONFIG actual_config;
        const IOTHUB_CLIENT_CONFIG* config = NULL;
        char* IoTHubName = NULL;
        char* IoTHubSuffix = NULL;

        memset(result, 0, sizeof(IOTHUB_CLIENT_CORE_LL_HANDLE_DATA));
        if (use_dev_auth)
        {
            if ((result->authorization_module = IoTHubClient_Auth_CreateFromDeviceAuth(client_config->deviceId, module_id)) == NULL)
            {
                LogError("Failed create authorization module");
                free(result);
                result = NULL;
            }
        }
        else
        {
            const char* device_key;
            const char* device_id;
            const char* sas_token;
            if (device_config == NULL)
            {
                device_key = client_config->deviceKey;
                device_id = client_config->deviceId;
                sas_token = client_config->deviceSasToken;
            }
            else
            {
                device_key = device_config->deviceKey;
                device_id = device_config->deviceId;
                sas_token = device_config->deviceSasToken;
            }

            if ((result->authorization_module = IoTHubClient_Auth_Create(device_key, device_id, sas_token, module_id)) == NULL)
            {
                LogError("Failed create authorization module");
                free(result);
                result = NULL;
            }
        }

        if (result != NULL)
        {
            TRANSPORT_CALLBACKS_INFO transport_cb;
            memset(&transport_cb, 0, sizeof(TRANSPORT_CALLBACKS_INFO));
            transport_cb.send_complete_cb = IoTHubClientCore_LL_SendComplete;
            transport_cb.twin_retrieve_prop_complete_cb = IoTHubClientCore_LL_RetrievePropertyComplete;
            transport_cb.twin_rpt_state_complete_cb = IoTHubClientCore_LL_ReportedStateComplete;
            transport_cb.connection_status_cb = IoTHubClientCore_LL_ConnectionStatusCallBack;
            transport_cb.prod_info_cb = IoTHubClientCore_LL_GetProductInfo;
            transport_cb.msg_input_cb = IoTHubClientCore_LL_MessageCallbackFromInput;
            transport_cb.msg_cb = IoTHubClientCore_LL_MessageCallback;
            transport_cb.method_complete_cb = IoTHubClientCore_LL_DeviceMethodComplete;
            transport_cb.get_model_id_cb = IoTHubClientCore_LL_GetModelId;

            if (client_config != NULL)
            {
                IOTHUBTRANSPORT_CONFIG lowerLayerConfig;
                memset(&lowerLayerConfig, 0, sizeof(IOTHUBTRANSPORT_CONFIG));
                lowerLayerConfig.upperConfig = client_config;
                lowerLayerConfig.waitingToSend = &(result->waitingToSend);
                lowerLayerConfig.auth_module_handle = result->authorization_module;
                lowerLayerConfig.moduleId = module_id;

                setTransportProtocol(result, (TRANSPORT_PROVIDER*)client_config->protocol());
                if ((result->transportHandle = result->IoTHubTransport_Create(&lowerLayerConfig, &transport_cb, result)) == NULL)
                {
                    LogError("underlying transport failed");
                    destroy_blob_upload_module(result);
                    destroy_module_method_module(result);
                    tickcounter_destroy(result->tickCounter);
                    IoTHubClient_Auth_Destroy(result->authorization_module);
                    free(result);
                    result = NULL;
                }
                else
                {
                    result->isSharedTransport = false;
                    config = client_config;
                }
            }
            else if (device_config != NULL)
            {
                STRING_HANDLE transport_hostname = NULL;

                result->transportHandle = device_config->transportHandle;
                setTransportProtocol(result, (TRANSPORT_PROVIDER*)device_config->protocol());

                if (result->IoTHubTransport_SetCallbackContext(result->transportHandle, result) != 0)
                {
                    LogError("unable to set transport callbacks");
                    IoTHubClient_Auth_Destroy(result->authorization_module);
                    free(result);
                    result = NULL;
                }
                else if ((transport_hostname = result->IoTHubTransport_GetHostname(result->transportHandle)) == NULL)
                {
                    LogError("unable to determine the transport IoTHub name");
                    IoTHubClient_Auth_Destroy(result->authorization_module);
                    free(result);
                    result = NULL;
                }
                else
                {
                    const char* hostname = STRING_c_str(transport_hostname);
                    /*the first '.' says where the iothubname finishes*/
                    const char* whereIsDot = strchr(hostname, '.');
                    if (whereIsDot == NULL)
                    {
                        LogError("unable to determine the IoTHub name");
                        IoTHubClient_Auth_Destroy(result->authorization_module);
                        free(result);
                        result = NULL;
                    }
                    else
                    {
                        size_t suffix_len = strlen(whereIsDot);
                        size_t calloc_size_hub_name = safe_add_size_t(safe_subtract_size_t(whereIsDot, hostname), 1);
                        size_t malloc_size_hub_suffix = safe_add_size_t(suffix_len, 1);
                        if (calloc_size_hub_name == SIZE_MAX ||
                            (IoTHubName = (char*)calloc(1, calloc_size_hub_name)) == NULL)
                        {
                            LogError("unable to calloc, size:%zu", calloc_size_hub_name);
                            IoTHubClient_Auth_Destroy(result->authorization_module);
                            free(result);
                            result = NULL;
                        }
                        else if (malloc_size_hub_suffix == SIZE_MAX ||
                            (IoTHubSuffix = (char*)malloc(malloc_size_hub_suffix)) == NULL)
                        {
                            LogError("unable to malloc");
                            IoTHubClient_Auth_Destroy(result->authorization_module);
                            free(IoTHubName);
                            free(result);
                            result = NULL;
                        }
                        else
                        {
                            (void)memcpy(IoTHubName, hostname, whereIsDot - hostname);
                            (void)strcpy(IoTHubSuffix, whereIsDot+1);

                            actual_config.deviceId = device_config->deviceId;
                            actual_config.deviceKey = device_config->deviceKey;
                            actual_config.deviceSasToken = device_config->deviceSasToken;
                            actual_config.iotHubName = IoTHubName;
                            actual_config.iotHubSuffix = IoTHubSuffix;
                            actual_config.protocol = NULL; /*irrelevant to IoTHubClientCore_LL_UploadToBlob*/
                            actual_config.protocolGatewayHostName = NULL; /*irrelevant to IoTHubClientCore_LL_UploadToBlob*/

                            config = &actual_config;

                            result->isSharedTransport = true;
                        }
                    }
                }
                STRING_delete(transport_hostname);
            }
        }
        if (result != NULL)
        {
            if (create_blob_upload_module(result, config, use_dev_auth) != 0)
            {
                LogError("unable to create blob upload");
                if (!result->isSharedTransport)
                {
                    result->IoTHubTransport_Destroy(result->transportHandle);
                }
                destroy_blob_upload_module(result);
                IoTHubClient_Auth_Destroy(result->authorization_module);
                free(result);
                result = NULL;
            }
            else if ((module_id != NULL) && create_edge_handle(result, config, module_id) != 0)
            {
                LogError("unable to create module method handle");
                if (!result->isSharedTransport)
                {
                    result->IoTHubTransport_Destroy(result->transportHandle);
                }
                destroy_blob_upload_module(result);
                IoTHubClient_Auth_Destroy(result->authorization_module);
                free(result);
                result = NULL;
            }
            else
            {
                PLATFORM_INFO_OPTION supportedPlatformInfo;
                if ((result->tickCounter = tickcounter_create()) == NULL)
                {
                    LogError("unable to get a tickcounter");
                    if (!result->isSharedTransport)
                    {
                        result->IoTHubTransport_Destroy(result->transportHandle);
                    }
                    destroy_blob_upload_module(result);
                    destroy_module_method_module(result);
                    IoTHubClient_Auth_Destroy(result->authorization_module);
                    free(result);
                    result = NULL;
                }
                // Add extended info to product info if required
                else if (result->IoTHubTransport_GetSupportedPlatformInfo(result->transportHandle, &supportedPlatformInfo) != 0)
                {
                    LogError("failed to get supported platform info");
                    if (!result->isSharedTransport)
                    {
                        result->IoTHubTransport_Destroy(result->transportHandle);
                    }
                    tickcounter_destroy(result->tickCounter);
                    destroy_blob_upload_module(result);
                    destroy_module_method_module(result);
                    IoTHubClient_Auth_Destroy(result->authorization_module);
                    free(result);
                    result = NULL;
                }
                else if ((result->product_info = make_product_info(NULL, supportedPlatformInfo)) == NULL)
                {
                    LogError("failed to initialize product info");
                    if (!result->isSharedTransport)
                    {
                        result->IoTHubTransport_Destroy(result->transportHandle);
                    }
                    tickcounter_destroy(result->tickCounter);
                    destroy_blob_upload_module(result);
                    destroy_module_method_module(result);
                    IoTHubClient_Auth_Destroy(result->authorization_module);
                    free(result);
                    result = NULL;
                }
                else if (config != NULL)
                {
                    DList_InitializeListHead(&(result->waitingToSend));
                    DList_InitializeListHead(&(result->iot_msg_queue));
                    DList_InitializeListHead(&(result->iot_ack_queue));
                    result->messageCallback.type = CALLBACK_TYPE_NONE;
                    result->methodCallback.type = CALLBACK_TYPE_NONE;
                    result->lastMessageReceiveTime = INDEFINITE_TIME;
                    result->data_msg_id = 1;

                    IOTHUB_DEVICE_CONFIG deviceConfig;
                    deviceConfig.deviceId = config->deviceId;
                    deviceConfig.deviceKey = config->deviceKey;
                    deviceConfig.deviceSasToken = config->deviceSasToken;
                    deviceConfig.authorization_module = result->authorization_module;
                    deviceConfig.moduleId = module_id;

                    if ((result->deviceHandle = result->IoTHubTransport_Register(result->transportHandle, &deviceConfig, &(result->waitingToSend))) == NULL)
                    {
                        LogError("Registering device in transport failed");
                        IoTHubClient_Auth_Destroy(result->authorization_module);
                        if (!result->isSharedTransport)
                        {
                            result->IoTHubTransport_Destroy(result->transportHandle);
                        }
                        destroy_blob_upload_module(result);
                        destroy_module_method_module(result);
                        tickcounter_destroy(result->tickCounter);
                        STRING_delete(result->product_info);
                        free(result);
                        result = NULL;
                    }
                    else
                    {
                        result->currentMessageTimeout = 0;
                        result->current_device_twin_timeout = 0;

                        result->diagnostic_setting.currentMessageNumber = 0;
                        result->diagnostic_setting.diagSamplingPercentage = 0;
                        if (IoTHubClientCore_LL_SetRetryPolicy(result, IOTHUB_CLIENT_RETRY_EXPONENTIAL_BACKOFF_WITH_JITTER, 0) != IOTHUB_CLIENT_OK)
                        {
                            LogError("Setting default retry policy in transport failed");
                            result->IoTHubTransport_Unregister(result->deviceHandle);
                            IoTHubClient_Auth_Destroy(result->authorization_module);
                            if (!result->isSharedTransport)
                            {
                                result->IoTHubTransport_Destroy(result->transportHandle);
                            }
                            destroy_blob_upload_module(result);
                            destroy_module_method_module(result);
                            tickcounter_destroy(result->tickCounter);
                            STRING_delete(result->product_info);
                            free(result);
                            result = NULL;
                        }
                    }
                }
            }
        }
        if (IoTHubName)
        {
            free(IoTHubName);
        }
        if (IoTHubSuffix)
        {
            free(IoTHubSuffix);
        }
    }
    return result;
}